

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

void __thiscall
unodb::detail::
basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::operator()(basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             *this,leaf_type *to_delete)

{
  unsigned_long leaf_size_00;
  unsigned_long leaf_size;
  leaf_type *to_delete_local;
  basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  leaf_size_00 = basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::get_size(to_delete);
  free_aligned(to_delete);
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::decrement_leaf_count
            (this->db,leaf_size_00);
  return;
}

Assistant:

inline void basic_db_leaf_deleter<Db>::operator()(
    leaf_type *to_delete) const noexcept {
#ifdef UNODB_DETAIL_WITH_STATS
  const auto leaf_size = to_delete->get_size();
#endif  // UNODB_DETAIL_WITH_STATS

  free_aligned(to_delete);

#ifdef UNODB_DETAIL_WITH_STATS
  db.decrement_leaf_count(leaf_size);
#endif  // UNODB_DETAIL_WITH_STATS
}